

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

string * __thiscall
TgBot::Api::downloadFile
          (string *__return_storage_ptr__,Api *this,string *filePath,
          vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *args)

{
  HttpClient *pHVar1;
  Url local_100;
  undefined1 local_5d;
  allocator local_49;
  undefined1 local_48 [8];
  string url;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *args_local;
  string *filePath_local;
  Api *this_local;
  string *serverResponse;
  
  url.field_2._8_8_ = args;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,"https://api.telegram.org/file/bot",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::__cxx11::string::operator+=((string *)local_48,(string *)this);
  std::__cxx11::string::operator+=((string *)local_48,"/");
  std::__cxx11::string::operator+=((string *)local_48,(string *)filePath);
  local_5d = 0;
  pHVar1 = this->_httpClient;
  Url::Url(&local_100,(string *)local_48);
  (*pHVar1->_vptr_HttpClient[2])(__return_storage_ptr__,pHVar1,&local_100,url.field_2._8_8_);
  Url::~Url(&local_100);
  local_5d = 1;
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

string Api::downloadFile(const string& filePath, const std::vector<HttpReqArg>& args) const {
    string url = "https://api.telegram.org/file/bot";
    url += _token;
    url += "/";
    url += filePath;

    string serverResponse = _httpClient.makeRequest(url, args);

    return serverResponse;
}